

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDIS.cpp
# Opt level: O3

int main(void)

{
  PointRecord1 *this;
  WorldCoordinates loc;
  Environmental_Process_PDU ourEnvProcPDU;
  Connection conn;
  KString local_1a0;
  EnvironmentRecordPtr local_180;
  WorldCoordinates local_168;
  Environmental_Process_PDU local_148;
  Connection local_e0;
  
  KDIS::PDU::Environmental_Process_PDU::Environmental_Process_PDU(&local_148);
  KDIS::DATA_TYPE::EntityIdentifier::EntityIdentifier((EntityIdentifier *)&local_e0,1,0x7b,1);
  KDIS::PDU::Environmental_Process_PDU::SetEnvironmentalProcessID
            (&local_148,(EntityIdentifier *)&local_e0);
  KDIS::DATA_TYPE::EntityIdentifier::~EntityIdentifier((EntityIdentifier *)&local_e0);
  KDIS::DATA_TYPE::EnvironmentType::EnvironmentType
            ((EnvironmentType *)&local_e0,Air,0,'\x03',SmallSize,'\0','\0');
  KDIS::PDU::Environmental_Process_PDU::SetEnvironmentType(&local_148,(EnvironmentType *)&local_e0);
  KDIS::DATA_TYPE::EnvironmentType::~EnvironmentType((EnvironmentType *)&local_e0);
  KDIS::DATA_TYPE::WorldCoordinates::WorldCoordinates
            (&local_168,4009770.2149574403,212482.4209212627,4940085.1217830265);
  KDIS::PDU::Environmental_Process_PDU::SetEnvironmentStatusOn(&local_148,true);
  KDIS::PDU::Environmental_Process_PDU::SetSequenceNumber(&local_148,0xffff);
  this = (PointRecord1 *)operator_new(0x30);
  KDIS::DATA_TYPE::PointRecord1::PointRecord1(this,'\0',&local_168);
  local_180._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00220b80;
  local_180.m_pRef = (EnvironmentRecord *)this;
  local_180.m_piCount = (RefCounter *)operator_new(2);
  *local_180.m_piCount = 1;
  KDIS::PDU::Environmental_Process_PDU::AddEnvironmentRecord(&local_148,&local_180);
  local_180._vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00220b80;
  KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::EnvironmentRecord>::unRef(&local_180);
  KDIS::PDU::Header6::SetExerciseID((Header6 *)&local_148,'\x01');
  KDIS::DATA_TYPE::TimeStamp::TimeStamp((TimeStamp *)&local_e0,RelativeTime,0,true);
  KDIS::PDU::Header6::SetTimeStamp((Header6 *)&local_148,(TimeStamp *)&local_e0);
  KDIS::DATA_TYPE::TimeStamp::~TimeStamp((TimeStamp *)&local_e0);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"192.168.3.255","");
  KDIS::NETWORK::Connection::Connection
            (&local_e0,&local_1a0,3000,false,true,(PDU_Factory *)0x0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  do {
    KDIS::NETWORK::Connection::SendPDU(&local_e0,&local_148.super_Header);
  } while( true );
}

Assistant:

int main()
{
    // First lets create the PDU object.
    Environmental_Process_PDU ourEnvProcPDU;

    ourEnvProcPDU.SetEnvironmentalProcessID( EntityIdentifier( 1, 123, 1 ) ); // The ID of our application (SiteID, AppID, ObjectID)
    ourEnvProcPDU.SetEnvironmentType( EnvironmentType( Air, 0, 3, SmallSize, 0, 0 ) ); // This value is taken from section 4 of the SISO-REF-010-2006. It represents a small cloud.

    // Convert local coordinate systems to DIS
    // 51.5� N 3.2� W. Cardiff, Wales.
    // A cloud over Wales, what a surprise!
    // Convert Degrees, Minutes, Seconds to decimal and then convert to geocentric.
    KFLOAT64 Lat = KDIS::UTILS::DMSToDecimal( 51.0, 5.0, 0.0 );
    KFLOAT64 Lon = KDIS::UTILS::DMSToDecimal( 3.0, 2.0, 0.0 );
    KFLOAT64 Alt = KDIS::UTILS::FeetToMeters( 3000.0 );
    KFLOAT64 GeoX = 0.0, GeoY = 0.0, GeoZ = 0.0;
    KDIS::UTILS::GeodeticToGeocentric( Lat, Lon, Alt, GeoX, GeoY, GeoZ, WGS_1984 );
    WorldCoordinates loc( GeoX, GeoY, GeoZ );
    ourEnvProcPDU.SetEnvironmentStatusOn( true );
    ourEnvProcPDU.SetSequenceNumber( EP_NO_SEQUENCE );
    ourEnvProcPDU.AddEnvironmentRecord( EnvironmentRecordPtr( new PointRecord1( 0, loc ) ) );

    // Set the PDU Header values
    ourEnvProcPDU.SetExerciseID( 1 );

    // Set the time stamp to automatically calculate.
    ourEnvProcPDU.SetTimeStamp( TimeStamp( RelativeTime, 0, true ) );

    // Note this multi cast address will probably be different for your network.
    Connection conn( "192.168.3.255" );

    KOCTET cBuffer[MAX_PDU_SIZE]; // Somewhere to store the data we send.

    try
    {
        while( true )
        {
            // Keep sending the pdu.
            conn.SendPDU( ( Header * )&ourEnvProcPDU );
        }
    }
    catch( exception & e )
    {
        cout << e.what() << endl;
    }

    return 0;
}